

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O1

Mesh * vera::boxMesh(Mesh *__return_storage_ptr__,float _width,float _height,float _depth,int _resX,
                    int _resY,int _resZ)

{
  pointer pvVar1;
  pointer pvVar2;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar3;
  int iVar4;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t _i;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint in_XMM2_Db;
  uint in_XMM2_Dc;
  uint in_XMM2_Dd;
  vec2 texcoord;
  vec3 vert;
  int local_168;
  float local_164;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_154;
  float local_150;
  float local_14c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  ulong local_130;
  ulong local_128;
  vec3 local_11c;
  ulong local_110;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  undefined8 local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  ulong local_e8;
  uint uStack_e0;
  uint uStack_dc;
  float local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  ulong local_c8;
  ulong local_c0;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  float local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_14c = _height;
  local_a8 = _depth;
  uStack_a4 = in_XMM2_Db;
  uStack_a0 = in_XMM2_Dc;
  uStack_9c = in_XMM2_Dd;
  local_58 = _width;
  uStack_54 = in_XMM0_Db;
  uStack_50 = in_XMM0_Dc;
  uStack_4c = in_XMM0_Dd;
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = TRIANGLES;
  uVar7 = 0;
  local_130 = (ulong)(_resX + 1);
  if (_resX < 1) {
    local_130 = uVar7;
  }
  local_128 = (ulong)(_resZ + 1);
  if (_resZ < 1) {
    local_128 = uVar7;
  }
  local_d8 = local_58 * 0.5;
  uStack_d4 = uStack_54;
  uStack_d0 = uStack_50;
  uStack_cc = uStack_4c;
  local_88 = ZEXT416((uint)(local_14c * 0.5));
  local_78 = ZEXT416((uint)(local_a8 * 0.5));
  local_11c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_11c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_134 = (float)(int)local_130;
  local_11c.field_2.z = 1.0;
  local_108.x = 0.0;
  local_110 = (ulong)(_resY + 1);
  if (_resY < 1) {
    local_110 = uVar7;
  }
  aVar5 = SUB84(local_110,0);
  local_138 = (float)aVar5.x;
  local_c8 = (ulong)(uint)_resZ;
  local_c0 = (ulong)(uint)_resX;
  local_90 = (ulong)(uint)_resY;
  if (0 < _resY) {
    fVar15 = local_134 + -1.0;
    fVar16 = local_138 + -1.0;
    uStack_e0 = uStack_50 ^ 0x80000000;
    uStack_dc = uStack_4c ^ 0x80000000;
    local_e8 = CONCAT44(uStack_54,local_d8) ^ 0x8000000080000000;
    uStack_f0 = 0x80000000;
    uStack_ec = 0x80000000;
    local_f8 = CONCAT44(0x80000000,-(local_14c * 0.5));
    uVar7 = 1;
    if (1 < (int)local_130) {
      uVar7 = local_130;
    }
    aVar3.x = 1.4013e-45;
    if (1 < (int)aVar5) {
      aVar3 = aVar5;
    }
    do {
      if (0 < (int)local_c0) {
        fVar17 = 1.0 - (float)local_108.x / fVar16;
        fVar18 = local_f8._0_4_ - (fVar17 + -1.0) * local_14c;
        iVar12 = 0;
        do {
          local_154.x = (float)iVar12 / fVar15;
          local_148.x = local_154.x * local_58 + (float)local_e8;
          local_140 = (float)local_78._0_4_;
          local_150 = fVar17;
          local_144 = fVar18;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_148);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_154);
          Mesh::addNormal(__return_storage_ptr__,&local_11c);
          iVar12 = iVar12 + 1;
        } while ((int)uVar7 != iVar12);
      }
      local_108.x = local_108.x + 1;
    } while (local_108 != aVar3);
  }
  iVar12 = (int)local_110 + -1;
  if (1 < (int)local_110) {
    iVar14 = (int)local_130;
    iVar4 = 0;
    uVar6 = 1;
    uVar7 = local_130 & 0xffffffff;
    do {
      iVar11 = (int)uVar7;
      uVar10 = uVar6;
      iVar13 = iVar14 + -1;
      if (1 < (int)local_130) {
        do {
          Mesh::addIndex(__return_storage_ptr__,uVar10 - 1);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          _i = (uint32_t)uVar7;
          Mesh::addIndex(__return_storage_ptr__,_i);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          Mesh::addIndex(__return_storage_ptr__,_i + 1);
          Mesh::addIndex(__return_storage_ptr__,_i);
          uVar10 = uVar10 + 1;
          uVar7 = (ulong)(_i + 1);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      iVar4 = iVar4 + 1;
      uVar7 = (ulong)(uint)(iVar11 + (int)local_130);
      uVar6 = uVar6 + (int)local_130;
    } while (iVar4 != iVar12);
  }
  pvVar1 = (__return_storage_ptr__->m_vertices).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (__return_storage_ptr__->m_vertices).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_11c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_11c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_11c.field_2.z = 0.0;
  local_13c = (float)(int)local_128;
  if (0 < (int)local_90) {
    fVar15 = local_13c + -1.0;
    local_b8 = local_138 + -1.0;
    local_68 = -(float)local_88._0_4_;
    uStack_64 = local_88._4_4_ ^ 0x80000000;
    uStack_60 = local_88._8_4_ ^ 0x80000000;
    uStack_5c = local_88._12_4_ ^ 0x80000000;
    uStack_e0 = uStack_a0 ^ 0x80000000;
    uStack_dc = uStack_9c ^ 0x80000000;
    local_e8 = CONCAT44(uStack_a4,local_a8) ^ 0x8000000080000000;
    iVar14 = 1;
    if (1 < (int)local_128) {
      iVar14 = (int)local_128;
    }
    iVar4 = 1;
    if (1 < (int)local_110) {
      iVar4 = (int)local_110;
    }
    local_f8 = CONCAT44(local_f8._4_4_,iVar4);
    local_108.x = 0.0;
    do {
      if (0 < (int)local_c8) {
        fVar16 = 1.0 - (float)local_108.x / local_b8;
        fVar17 = local_68 - (fVar16 + -1.0) * local_14c;
        iVar4 = 0;
        do {
          local_154.x = (float)iVar4 / fVar15;
          local_148.x = local_d8;
          local_140 = local_154.x * (float)local_e8 + (float)local_78._0_4_;
          local_150 = fVar16;
          local_144 = fVar17;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_148);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_154);
          Mesh::addNormal(__return_storage_ptr__,&local_11c);
          iVar4 = iVar4 + 1;
        } while (iVar14 != iVar4);
      }
      local_108.x = local_108.x + 1;
    } while (local_108 != local_f8._0_4_);
  }
  if (1 < (int)local_110) {
    uVar7 = ((long)pvVar1 - (long)pvVar2 >> 2) * -0x5555555555555555;
    iVar14 = (int)local_128;
    uVar6 = iVar14 + (int)uVar7;
    iVar4 = 0;
    do {
      uVar9 = uVar7 & 0xffffffff;
      uVar10 = uVar6;
      iVar13 = iVar14 + -1;
      if (1 < (int)local_128) {
        do {
          Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar9);
          uVar8 = (uint32_t)uVar9 + 1;
          uVar9 = (ulong)uVar8;
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          iVar13 = iVar13 + -1;
          uVar10 = uVar10 + 1;
        } while (iVar13 != 0);
      }
      iVar4 = iVar4 + 1;
      uVar6 = uVar6 + (int)local_128;
      uVar7 = (ulong)(uint)((int)uVar7 + (int)local_128);
    } while (iVar4 != iVar12);
  }
  local_f8 = (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_11c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  local_11c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_11c.field_2.z = 0.0;
  if (0 < (int)local_90) {
    fVar15 = local_13c + -1.0;
    local_68 = local_138 + -1.0;
    local_108.x = local_d8 ^ 0x80000000;
    uStack_104 = uStack_d4 ^ 0x80000000;
    uStack_100 = uStack_d0 ^ 0x80000000;
    uStack_fc = uStack_cc ^ 0x80000000;
    local_48 = -(float)local_88._0_4_;
    uStack_44 = local_88._4_4_ ^ 0x80000000;
    uStack_40 = local_88._8_4_ ^ 0x80000000;
    uStack_3c = local_88._12_4_ ^ 0x80000000;
    uStack_e0 = local_78._8_4_ ^ 0x80000000;
    uStack_dc = local_78._12_4_ ^ 0x80000000;
    local_e8 = local_78._0_8_ ^ 0x8000000080000000;
    iVar14 = 1;
    if (1 < (int)local_128) {
      iVar14 = (int)local_128;
    }
    local_b8 = 1.4013e-45;
    if (1 < (int)(float)local_110) {
      local_b8 = (float)local_110;
    }
    fVar16 = 0.0;
    do {
      if (0 < (int)local_c8) {
        fVar17 = 1.0 - (float)(int)fVar16 / local_68;
        fVar18 = local_48 - (fVar17 + -1.0) * local_14c;
        iVar4 = 0;
        do {
          local_154.x = (float)iVar4 / fVar15;
          local_148 = local_108;
          local_140 = local_154.x * local_a8 + (float)local_e8;
          local_150 = fVar17;
          local_144 = fVar18;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_148);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_154);
          Mesh::addNormal(__return_storage_ptr__,&local_11c);
          iVar4 = iVar4 + 1;
        } while (iVar14 != iVar4);
      }
      fVar16 = (float)((int)fVar16 + 1);
    } while (fVar16 != local_b8);
  }
  if (1 < (int)local_110) {
    local_f8 = ((long)local_f8 >> 2) * -0x5555555555555555;
    iVar14 = (int)local_128;
    uVar6 = iVar14 + (int)local_f8;
    iVar4 = 0;
    do {
      uVar7 = local_f8 & 0xffffffff;
      uVar10 = uVar6;
      iVar13 = iVar14 + -1;
      if (1 < (int)local_128) {
        do {
          Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar7);
          uVar8 = (uint32_t)uVar7 + 1;
          uVar7 = (ulong)uVar8;
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          iVar13 = iVar13 + -1;
          uVar10 = uVar10 + 1;
        } while (iVar13 != 0);
      }
      iVar4 = iVar4 + 1;
      uVar6 = uVar6 + (int)local_128;
      local_f8 = (ulong)(uint)((int)local_f8 + (int)local_128);
    } while (iVar4 != iVar12);
  }
  local_f8 = (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_11c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_11c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_11c.field_2.z = -1.0;
  if (0 < (int)local_90) {
    fVar15 = local_134 + -1.0;
    local_138 = local_138 + -1.0;
    local_108.x = local_58 ^ 0x80000000;
    uStack_104 = uStack_54 ^ 0x80000000;
    uStack_100 = uStack_50 ^ 0x80000000;
    uStack_fc = uStack_4c ^ 0x80000000;
    local_68 = -(float)local_88._0_4_;
    uStack_64 = local_88._4_4_ ^ 0x80000000;
    uStack_60 = local_88._8_4_ ^ 0x80000000;
    uStack_5c = local_88._12_4_ ^ 0x80000000;
    uStack_e0 = local_78._8_4_ ^ 0x80000000;
    uStack_dc = local_78._12_4_ ^ 0x80000000;
    local_e8 = local_78._0_8_ ^ 0x8000000080000000;
    iVar14 = 1;
    if (1 < (int)local_130) {
      iVar14 = (int)local_130;
    }
    local_b8 = 1.4013e-45;
    if (1 < (int)(float)local_110) {
      local_b8 = (float)local_110;
    }
    fVar16 = 0.0;
    do {
      if (0 < (int)local_c0) {
        fVar17 = 1.0 - (float)(int)fVar16 / local_138;
        fVar18 = local_68 - (fVar17 + -1.0) * local_14c;
        iVar4 = 0;
        do {
          local_154.x = (float)iVar4 / fVar15;
          local_148.x = local_154.x * local_108.x + local_d8;
          local_140 = (float)local_e8;
          local_150 = fVar17;
          local_144 = fVar18;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_148);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_154);
          Mesh::addNormal(__return_storage_ptr__,&local_11c);
          iVar4 = iVar4 + 1;
        } while (iVar14 != iVar4);
      }
      fVar16 = (float)((int)fVar16 + 1);
    } while (fVar16 != local_b8);
  }
  if (1 < (int)local_110) {
    uVar7 = ((long)local_f8 >> 2) * -0x5555555555555555;
    iVar14 = (int)local_130;
    uVar6 = iVar14 + (int)uVar7;
    iVar4 = 0;
    do {
      uVar9 = uVar7 & 0xffffffff;
      uVar10 = uVar6;
      iVar13 = iVar14 + -1;
      local_f8 = uVar7;
      if (1 < (int)local_130) {
        do {
          Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar9);
          uVar8 = (uint32_t)uVar9 + 1;
          uVar9 = (ulong)uVar8;
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10 + 1);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          iVar13 = iVar13 + -1;
          uVar10 = uVar10 + 1;
        } while (iVar13 != 0);
      }
      iVar4 = iVar4 + 1;
      uVar6 = uVar6 + (int)local_130;
      uVar7 = (ulong)(uint)((int)local_f8 + (int)local_130);
    } while (iVar4 != iVar12);
  }
  pvVar1 = (__return_storage_ptr__->m_vertices).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar2 = (__return_storage_ptr__->m_vertices).
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_11c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_11c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0xbf800000;
  local_11c.field_2.z = 0.0;
  if (0 < (int)local_c8) {
    fVar15 = local_134 + -1.0;
    local_f8 = CONCAT44(local_f8._4_4_,local_13c + -1.0);
    uStack_e0 = uStack_d0 ^ 0x80000000;
    uStack_dc = uStack_cc ^ 0x80000000;
    local_e8 = CONCAT44(uStack_d4,local_d8) ^ 0x8000000080000000;
    local_108.x = -(float)local_88._0_4_;
    uStack_104 = local_88._4_4_ ^ 0x80000000;
    uStack_100 = local_88._8_4_ ^ 0x80000000;
    uStack_fc = local_88._12_4_ ^ 0x80000000;
    local_b8 = -(float)local_78._0_4_;
    uStack_b4 = local_78._4_4_ ^ 0x80000000;
    uStack_b0 = local_78._8_4_ ^ 0x80000000;
    uStack_ac = local_78._12_4_ ^ 0x80000000;
    iVar12 = 1;
    if (1 < (int)local_130) {
      iVar12 = (int)local_130;
    }
    local_14c = 1.4013e-45;
    if (1 < (int)(float)local_128) {
      local_14c = (float)local_128;
    }
    local_164 = 0.0;
    do {
      if (0 < (int)local_c0) {
        fVar16 = 1.0 - (float)(int)local_164 / local_f8._0_4_;
        fVar17 = fVar16 * local_a8 + local_b8;
        iVar14 = 0;
        do {
          local_154.x = (float)iVar14 / fVar15;
          local_148.x = local_154.x * local_58 + (float)local_e8;
          local_144 = local_108.x;
          local_150 = fVar16;
          local_140 = fVar17;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_148);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_154);
          Mesh::addNormal(__return_storage_ptr__,&local_11c);
          iVar14 = iVar14 + 1;
        } while (iVar12 != iVar14);
      }
      local_164 = (float)((int)local_164 + 1);
    } while (local_164 != local_14c);
  }
  local_108 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)((int)local_128 + -1);
  if (1 < (int)local_128) {
    uVar7 = ((long)pvVar1 - (long)pvVar2 >> 2) * -0x5555555555555555;
    iVar12 = (int)local_130;
    uVar6 = iVar12 + (int)uVar7;
    iVar14 = 0;
    do {
      uVar9 = uVar7 & 0xffffffff;
      iVar4 = iVar12 + -1;
      uVar10 = uVar6;
      if (1 < (int)local_130) {
        do {
          Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar9);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          uVar8 = (uint32_t)uVar9 + 1;
          uVar9 = (ulong)uVar8;
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          uVar10 = uVar10 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      iVar14 = iVar14 + 1;
      uVar6 = uVar6 + (int)local_130;
      uVar7 = (ulong)(uint)((int)uVar7 + (int)local_130);
    } while ((anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar14 != local_108);
  }
  local_e8 = (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->m_vertices).
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_11c.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_11c.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_11c.field_2.z = 0.0;
  if (0 < (int)local_c8) {
    local_134 = local_134 + -1.0;
    local_13c = local_13c + -1.0;
    local_d8 = -local_d8;
    uStack_d4 = uStack_d4 ^ 0x80000000;
    uStack_d0 = uStack_d0 ^ 0x80000000;
    uStack_cc = uStack_cc ^ 0x80000000;
    local_a8 = -local_a8;
    uStack_a4 = uStack_a4 ^ 0x80000000;
    uStack_a0 = uStack_a0 ^ 0x80000000;
    uStack_9c = uStack_9c ^ 0x80000000;
    iVar12 = 1;
    if (1 < (int)local_130) {
      iVar12 = (int)local_130;
    }
    iVar14 = 1;
    if (1 < (int)local_128) {
      iVar14 = (int)local_128;
    }
    local_168 = 0;
    do {
      if (0 < (int)local_c0) {
        fVar15 = 1.0 - (float)local_168 / local_13c;
        fVar16 = fVar15 * local_a8 + (float)local_78._0_4_;
        iVar4 = 0;
        do {
          local_154.x = (float)iVar4 / local_134;
          local_148.x = local_154.x * local_58 + local_d8;
          local_144 = (float)local_88._0_4_;
          local_150 = fVar15;
          local_140 = fVar16;
          Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_148);
          Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_154);
          Mesh::addNormal(__return_storage_ptr__,&local_11c);
          iVar4 = iVar4 + 1;
        } while (iVar12 != iVar4);
      }
      local_168 = local_168 + 1;
    } while (local_168 != iVar14);
  }
  if (1 < (int)local_128) {
    uVar7 = ((long)local_e8 >> 2) * -0x5555555555555555;
    local_d8 = (float)((int)local_130 + -1);
    uVar6 = (int)local_130 + (int)uVar7;
    iVar12 = 0;
    do {
      uVar9 = uVar7 & 0xffffffff;
      fVar15 = local_d8;
      uVar10 = uVar6;
      local_e8 = uVar7;
      if (1 < (int)local_130) {
        do {
          Mesh::addIndex(__return_storage_ptr__,(uint32_t)uVar9);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          uVar8 = (uint32_t)uVar9 + 1;
          uVar9 = (ulong)uVar8;
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar8);
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          uVar10 = uVar10 + 1;
          Mesh::addIndex(__return_storage_ptr__,uVar10);
          fVar15 = (float)((int)fVar15 + -1);
        } while (fVar15 != 0.0);
      }
      iVar12 = iVar12 + 1;
      uVar6 = uVar6 + (int)local_130;
      uVar7 = (ulong)(uint)((int)local_e8 + (int)local_130);
    } while ((anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)iVar12 != local_108);
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh boxMesh( float _width, float _height, float _depth, int _resX, int _resY, int _resZ ) {

    // mesh only available as triangles //
    Mesh mesh;
    mesh.setDrawMode( TRIANGLES );

    _resX = _resX + 1;
    _resY = _resY + 1;
    _resZ = _resZ + 1;

    if ( _resX < 2 ) _resX = 0;
    if ( _resY < 2 ) _resY = 0;
    if ( _resZ < 2 ) _resZ = 0;

    // halves //
    float halfW = _width * .5f;
    float halfH = _height * .5f;
    float halfD = _depth * .5f;

    glm::vec3 vert;
    glm::vec3 normal;
    glm::vec2 texcoord;
    std::size_t vertOffset = 0;

    // TRIANGLES //

    // Front Face //
    normal = {0.f, 0.f, 1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * _width - halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Right Side Face //
    normal = {1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f - ((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Left Side Face //
    normal = {-1.f, 0.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resZ; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resZ-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            //vert.x = texcoord.x * _width - halfW;
            vert.x = -halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = texcoord.x * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resZ-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resZ + x + vertOffset);
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resZ + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Back Face //
    normal = {0.f, 0.f, -1.f};
    // add the vertexes //
    for (int iy = 0; iy < _resY; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resY-1.f));

            vert.x = texcoord.x * -_width + halfW;
            vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.z = -halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resY-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();


    // Top Face //
    normal = {0.f, -1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = -halfH;
            vert.z = texcoord.y * _depth - halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }

    vertOffset = mesh.getVerticesTotal();

    // Bottom Face //
    normal = {0.f, 1.f, 0.f};
    // add the vertexes //
    for (int iy = 0; iy < _resZ; iy++) {
        for (int ix = 0; ix < _resX; ix++) {

            // normalized tex coords //
            texcoord.x = ((float)ix/((float)_resX-1.f));
            texcoord.y = 1.f-((float)iy/((float)_resZ-1.f));

            vert.x = texcoord.x * _width - halfW;
            //vert.y = -(texcoord.y-1.f) * _height - halfH;
            vert.y = halfH;
            vert.z = texcoord.y * -_depth + halfD;

            mesh.addVertex(vert);
            mesh.addTexCoord(texcoord);
            mesh.addNormal(normal);
        }
    }

    for (int y = 0; y < _resZ-1; y++) {
        for (int x = 0; x < _resX-1; x++) {
            // first triangle //
            mesh.addIndex((y)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y)*_resX + x+1 + vertOffset);

            // second triangle //
            mesh.addIndex((y)*_resX + x+1 + vertOffset);
            mesh.addIndex((y+1)*_resX + x + vertOffset);
            mesh.addIndex((y+1)*_resX + x+1 + vertOffset);
        }
    }
    mesh.computeTangents();

    return mesh;
}